

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O3

void __thiscall tcmalloc::PageHeap::RegisterSizeClass(PageHeap *this,Span *span,uint32_t sc)

{
  long lVar1;
  ulong uVar2;
  
  span->field_0x2a = (char)sc;
  if (1 < span->length - 1) {
    uVar2 = span->start;
    lVar1 = span->length - 2;
    do {
      uVar2 = uVar2 + 1;
      (this->pagemap_).root_[uVar2 >> 0x12]->values[(uint)uVar2 & 0x3ffff] = span;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void PageHeap::RegisterSizeClass(Span* span, uint32_t sc) {
  // Associate span object with all interior pages as well
  ASSERT(span->location == Span::IN_USE);
  ASSERT(GetDescriptor(span->start) == span);
  ASSERT(GetDescriptor(span->start+span->length-1) == span);
  span->sizeclass = sc;
  for (Length i = 1; i < span->length-1; i++) {
    pagemap_.set(span->start+i, span);
  }
}